

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorBase::grow_pod
          (SmallVectorBase *this,void *FirstEl,size_t MinSizeInBytes,size_t TSize)

{
  size_t __n;
  size_t sVar1;
  void *local_40;
  void *NewElts;
  size_t NewCapacityInBytes;
  size_t CurSizeBytes;
  size_t TSize_local;
  size_t MinSizeInBytes_local;
  void *FirstEl_local;
  SmallVectorBase *this_local;
  
  __n = size_in_bytes(this);
  sVar1 = capacity_in_bytes(this);
  NewElts = (void *)(sVar1 * 2 + TSize);
  if (NewElts < MinSizeInBytes) {
    NewElts = (void *)MinSizeInBytes;
  }
  if (this->BeginX == FirstEl) {
    local_40 = malloc((size_t)NewElts);
    memcpy(local_40,this->BeginX,__n);
  }
  else {
    local_40 = realloc(this->BeginX,(size_t)NewElts);
  }
  this->EndX = (void *)((long)local_40 + __n);
  this->BeginX = local_40;
  this->CapacityX = (void *)((long)this->BeginX + (long)NewElts);
  return;
}

Assistant:

void grow_pod(void *FirstEl, size_t MinSizeInBytes, size_t TSize){
    size_t CurSizeBytes = size_in_bytes();
    size_t NewCapacityInBytes = 2 * capacity_in_bytes() + TSize; // Always grow.
    if (NewCapacityInBytes < MinSizeInBytes) {
      NewCapacityInBytes = MinSizeInBytes;
    }

    void *NewElts;
    if (BeginX == FirstEl) {
      NewElts = std::malloc(NewCapacityInBytes);

      // Copy the elements over.  No need to run dtors on PODs.
      memcpy(NewElts, this->BeginX, CurSizeBytes);
    } else {
      // If this wasn't grown from the inline copy, grow the allocated space.
      NewElts = realloc(this->BeginX, NewCapacityInBytes);
    }
    //assert(NewElts && "Out of memory");

    this->EndX = (char*)NewElts+CurSizeBytes;
    this->BeginX = NewElts;
    this->CapacityX = (char*)this->BeginX + NewCapacityInBytes;
  }